

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_flattening.cpp
# Opt level: O0

void __thiscall
ModelFlattening_modelWithoutImports_Test::~ModelFlattening_modelWithoutImports_Test
          (ModelFlattening_modelWithoutImports_Test *this)

{
  ModelFlattening_modelWithoutImports_Test *this_local;
  
  ~ModelFlattening_modelWithoutImports_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ModelFlattening, modelWithoutImports)
{
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"units\">\n"
        "  <units name=\"ms\">\n"
        "    <unit prefix=\"milli\" units=\"second\"/>\n"
        "  </units>\n"
        "</model>\n";

    auto parser = libcellml::Parser::create();
    auto modelUnitsDefinitions = parser->parseModel(e);
    auto importer = libcellml::Importer::create();

    EXPECT_FALSE(modelUnitsDefinitions->hasUnresolvedImports());

    auto flatModel = importer->flattenModel(modelUnitsDefinitions);

    auto printer = libcellml::Printer::create();

    auto a = printer->printModel(flatModel);
    EXPECT_EQ(e, a);
}